

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

double VP8LBitsEntropy(uint32_t *array,int n)

{
  undefined4 in_ESI;
  double dVar1;
  VP8LBitEntropy entropy;
  VP8LBitEntropy *in_stack_ffffffffffffffe0;
  uint32_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  VP8LBitsEntropyUnrefined
            ((uint32_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
             in_stack_ffffffffffffffe0);
  dVar1 = BitsEntropyRefine((VP8LBitEntropy *)&stack0xffffffffffffffd8);
  return dVar1;
}

Assistant:

double VP8LBitsEntropy(const uint32_t* const array, int n) {
  VP8LBitEntropy entropy;
  VP8LBitsEntropyUnrefined(array, n, &entropy);

  return BitsEntropyRefine(&entropy);
}